

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

string * __thiscall
soul::ExpressionHelpers::resolvePartialNameAsUID_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionHelpers *this,ModuleBase *module,
          IdentifierPath *partialName)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  ulong extraout_RDX;
  soul *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  NameSearch local_e0;
  
  local_e0.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_e0.itemsFound.space;
  local_e0.itemsFound.numActive = 0;
  local_e0.itemsFound.numAllocated = 8;
  puVar1 = local_e0.partiallyQualifiedPath.pathSections.space;
  local_e0.partiallyQualifiedPath.pathSections.numActive = 0;
  local_e0.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_e0.stopAtFirstScopeWithResults = false;
  local_e0.requiredNumFunctionArgs = -1;
  local_e0.findVariables = true;
  local_e0.findTypes = true;
  local_e0.findFunctions = true;
  local_e0.findNamespaces = true;
  local_e0.findProcessors = true;
  local_e0.findProcessorInstances = false;
  local_e0.findEndpoints = true;
  local_e0.onlyFindLocalVariables = false;
  local_e0.partiallyQualifiedPath.pathSections.items = (Identifier *)puVar1;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_e0.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)module);
  local_e0.stopAtFirstScopeWithResults = true;
  local_e0.findProcessors = true;
  local_e0._184_4_ = 0x1010101;
  local_e0.findProcessorInstances = false;
  local_e0.findEndpoints = true;
  AST::Scope::performFullNameSearch((Scope *)(this + 0x28),&local_e0,(Statement *)0x0);
  if (local_e0.itemsFound.numActive != 0) {
    uVar2 = *(uint64_t *)local_e0.itemsFound.items;
    if (uVar2 == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = extraout_RDX;
      auVar3 = auVar3 << 0x40;
    }
    else {
      auVar3 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::ModuleBase::typeinfo,0);
    }
    if (auVar3._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar3._0_8_,auVar3._8_8_);
      goto LAB_0024819d;
    }
    if (uVar2 == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = auVar3._8_8_;
      auVar4 = auVar4 << 0x40;
    }
    else {
      auVar4 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::TypeDeclarationBase::typeinfo,0)
      ;
    }
    if (auVar4._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar4._0_8_,auVar4._8_8_);
      goto LAB_0024819d;
    }
    if (uVar2 == 0) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = auVar4._8_8_;
      auVar5 = auVar5 << 0x40;
    }
    else {
      auVar5 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::VariableDeclaration::typeinfo,0)
      ;
    }
    if (auVar5._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar5._0_8_,auVar5._8_8_);
      goto LAB_0024819d;
    }
    if (uVar2 == 0) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = auVar5._8_8_;
      auVar6 = auVar6 << 0x40;
    }
    else {
      auVar6 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::EndpointDeclaration::typeinfo,0)
      ;
    }
    if (auVar6._0_8_ != (soul *)0x0) {
      makeUID_abi_cxx11_(__return_storage_ptr__,auVar6._0_8_,auVar6._8_8_);
      goto LAB_0024819d;
    }
    if (uVar2 == 0) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = auVar6._8_8_;
      auVar7 = auVar7 << 0x40;
    }
    else {
      auVar7 = __dynamic_cast(uVar2,&AST::ASTObject::typeinfo,&AST::Function::typeinfo,0);
    }
    this_00 = auVar7._0_8_;
    if ((this_00 != (soul *)0x0) &&
       (makeUID_abi_cxx11_(__return_storage_ptr__,this_00,auVar7._8_8_), this_00 != (soul *)0x0))
    goto LAB_0024819d;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0024819d:
  local_e0.partiallyQualifiedPath.pathSections.numActive = 0;
  if (8 < local_e0.partiallyQualifiedPath.pathSections.numAllocated) {
    if (local_e0.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
      operator_delete__(local_e0.partiallyQualifiedPath.pathSections.items);
    }
    local_e0.partiallyQualifiedPath.pathSections.numAllocated = 8;
    local_e0.partiallyQualifiedPath.pathSections.items = (Identifier *)puVar1;
  }
  local_e0.itemsFound.numActive = 0;
  if ((8 < local_e0.itemsFound.numAllocated) &&
     (local_e0.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_e0.itemsFound.items);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string resolvePartialNameAsUID (AST::ModuleBase& module, const IdentifierPath& partialName)
    {
        AST::Scope::NameSearch search;
        search.partiallyQualifiedPath = partialName;
        search.stopAtFirstScopeWithResults = true;
        search.findVariables = true;
        search.findTypes = true;
        search.findFunctions = true;
        search.findNamespaces = true;
        search.findProcessors = true;
        search.findProcessorInstances = false;
        search.findEndpoints = true;

        module.performFullNameSearch (search, nullptr);

        if (search.itemsFound.size() != 0)
        {
            auto item = search.itemsFound.front();

            if (auto mb = cast<AST::ModuleBase> (item))            return makeUID (*mb);
            if (auto t = cast<AST::TypeDeclarationBase> (item))    return makeUID (*t);
            if (auto v = cast<AST::VariableDeclaration> (item))    return makeUID (*v);
            if (auto e = cast<AST::EndpointDeclaration> (item))    return makeUID (*e);
            if (auto f = cast<AST::Function> (item))               return makeUID (*f);
        }

        return {};
    }